

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_brts_no_zeroinit.h
# Opt level: O2

void __thiscall
BRTS_XZ<TTA>::PerformLabelingMem
          (BRTS_XZ<TTA> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  int *piVar1;
  undefined8 uVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  int _width;
  Mat1b *pMVar6;
  pointer puVar7;
  pointer piVar8;
  BRTS_XZ<TTA> *pBVar9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar10;
  Run *pRVar11;
  ulong uVar12;
  Run *pRVar13;
  void *__child_stack;
  Run *runs;
  ulong uVar14;
  double dVar15;
  allocator_type local_2b1;
  Data_Compressed *local_2b0;
  Runs *local_2a8;
  BRTS_XZ<TTA> *local_2a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_298;
  value_type_conflict3 local_290;
  Size local_288;
  MemMat<int> img_labels;
  Mat_<int> local_1b8;
  Mat local_158 [96];
  MemMat<unsigned_char> img;
  
  cv::Mat::Mat(local_158,&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat);
  MemMat<unsigned_char>::MemMat(&img,(Mat_<unsigned_char> *)local_158);
  local_298 = accesses;
  cv::Mat::~Mat(local_158);
  uVar2 = **(undefined8 **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_288.height = (int)uVar2;
  local_288.width = (int)((ulong)uVar2 >> 0x20);
  MemMat<int>::MemMat(&img_labels,&local_288,0);
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar5 = *(uint *)&pMVar6->field_0x8;
  _width = *(int *)&pMVar6->field_0xc;
  local_2b0 = &this->data_compressed;
  Data_Compressed::Alloc(local_2b0,uVar5,_width);
  InitCompressedDataMem(this,local_2b0,&img);
  local_2a8 = &this->data_runs;
  Runs::Alloc(local_2a8,uVar5,_width);
  uVar2 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  TTA::MemAlloc((((int)((ulong)uVar2 >> 0x20) + 1) / 2) * (((int)uVar2 + 1) / 2) + 1);
  TTA::MemSetup();
  runs = (this->data_runs).runs;
  FindRunsMem(this,(this->data_compressed).bits,uVar5,(this->data_compressed).data_width,runs);
  pRVar13 = (this->data_runs).runs;
  uVar12 = 0;
  uVar14 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar14 = uVar12;
  }
  for (; piVar8 = TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,
      puVar7 = TTA::mem_rtable_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
               ._M_impl.super__Vector_impl_data._M_start, uVar12 != uVar14; uVar12 = uVar12 + 1) {
    runs = (Run *)0x0;
    pRVar11 = pRVar13;
    do {
      pRVar13 = pRVar11;
      uVar3 = pRVar13->start_pos;
      if ((ulong)uVar3 == 0xffff) {
        for (runs = (Run *)(long)(int)runs; (long)runs < (long)_width;
            runs = (Run *)((long)&runs->start_pos + 1)) {
          piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar12 +
                           img_labels.accesses_._16_8_ + (long)runs * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)
           (*(long *)img_labels.img_._72_8_ * uVar12 + img_labels.img_._16_8_ + (long)runs * 4) = 0;
        }
        pRVar13 = pRVar13 + 1;
      }
      else {
        uVar4 = pRVar13->end_pos;
        uVar5 = pRVar13->label;
        piVar8[(int)uVar5] = piVar8[(int)uVar5] + 1;
        uVar5 = puVar7[(int)uVar5];
        for (runs = (Run *)(long)(int)runs; (long)runs < (long)(ulong)uVar3;
            runs = (Run *)((long)&runs->start_pos + 1)) {
          piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar12 +
                           img_labels.accesses_._16_8_ + (long)runs * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)
           (*(long *)img_labels.img_._72_8_ * uVar12 + img_labels.img_._16_8_ + (long)runs * 4) = 0;
        }
        for (; (long)runs < (long)(ulong)uVar4; runs = (Run *)((long)&runs->start_pos + 1)) {
          piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar12 +
                           img_labels.accesses_._16_8_ + (long)runs * 4);
          *piVar1 = *piVar1 + 1;
          *(uint *)(*(long *)img_labels.img_._72_8_ * uVar12 + img_labels.img_._16_8_ +
                   (long)runs * 4) = uVar5;
        }
      }
      pRVar11 = pRVar13 + 1;
    } while (uVar3 != 0xffff);
  }
  local_290 = 0;
  local_2a0 = this;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8,4,&local_290,
             &local_2b1);
  pvVar10 = local_298;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign(local_298,&local_1b8);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8);
  dVar15 = MemMat<unsigned_char>::GetTotalAccesses(&img);
  pBVar9 = local_2a0;
  *(pvVar10->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
   super__Vector_impl_data._M_start =
       (long)(dVar15 - 9.223372036854776e+18) & (long)dVar15 >> 0x3f | (long)dVar15;
  dVar15 = MemMat<int>::GetTotalAccesses(&img_labels);
  (pvVar10->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[1] =
       (long)dVar15 >> 0x3f & (long)(dVar15 - 9.223372036854776e+18) | (long)dVar15;
  dVar15 = TTA::MemTotalAccesses();
  __child_stack =
       (void *)((long)dVar15 >> 0x3f & (long)(dVar15 - 9.223372036854776e+18) | (long)dVar15);
  (pvVar10->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[2] = (unsigned_long)__child_stack;
  cv::Mat_<int>::clone
            (&local_1b8,(__fn *)&img_labels.img_,__child_stack,
             (int)(long)(dVar15 - 9.223372036854776e+18),runs);
  cv::Mat::operator=(&((pBVar9->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     &local_1b8.super_Mat);
  cv::Mat::~Mat(&local_1b8.super_Mat);
  Runs::Dealloc(local_2a8);
  Data_Compressed::Dealloc(local_2b0);
  MemMat<int>::~MemMat(&img_labels);
  MemMat<unsigned_char>::~MemMat(&img);
  return;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses) {
        //Data structure for memory test
        MemMat<unsigned char> img(img_);
        MemMat<int> img_labels(img_.size(), 0);

        int w(img_.cols);
        int h(img_.rows);

        data_compressed.Alloc(h, w);
        InitCompressedDataMem(data_compressed, img);

        //find runs
        data_runs.Alloc(h, w);
        LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::MemSetup();
        FindRunsMem(data_compressed.bits, h, data_compressed.data_width, data_runs.runs);

        Run* runs = data_runs.runs;
        for (int i = 0; i < h; i++) {
            for (int j = 0;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    for (; j < w; j++) img_labels(i, j) = 0;
                    runs++;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::MemGetLabel(runs->label);
                for (; j < start_pos; j++) img_labels(i, j) = 0;
                for (; j < end_pos; j++) img_labels(i, j) = label;
            }
        }

        // Store total accesses in the output vector 'accesses'
        accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

        accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
        accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
        accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

        img_labels_ = img_labels.GetImage();

        LabelsSolver::MemDealloc();
        data_runs.Dealloc();
        data_compressed.Dealloc();
    }